

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_session.c
# Opt level: O3

char * get_Date_line(void)

{
  char acStack_48 [72];
  
  get_current_time();
  return acStack_48;
}

Assistant:

char *get_Date_line(){
    char date[64] = "Date:", *d;
    char *time;
    strcat(date, get_current_time());
    strcat(date, " GMT\r\n");
    d = date;
    return d;
}